

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetBooleanVerifier::verifyStencilMaskInitial
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,int stencilBits)

{
  GLenum pname;
  bool bVar1;
  qpTestResult qVar2;
  uchar *puVar3;
  TestLog *this_00;
  MessageBuilder *this_01;
  MessageBuilder local_1a8;
  StateQueryMemoryWriteGuard<unsigned_char> local_23;
  int local_20;
  GLenum GStack_1c;
  StateQueryMemoryWriteGuard<unsigned_char> state;
  int stencilBits_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetBooleanVerifier *this_local;
  
  local_20 = stencilBits;
  GStack_1c = name;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::StateQueryMemoryWriteGuard
            (&local_23);
  pname = GStack_1c;
  puVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::operator&
                     (&local_23);
  glu::CallLogWrapper::glGetBooleanv(&(this->super_StateVerifier).super_CallLogWrapper,pname,puVar3)
  ;
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&local_23,testCtx);
  if (((bVar1) && (0 < local_20)) &&
     (puVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_unsigned_char_((StateQueryMemoryWriteGuard *)&local_23),
     *puVar3 != '\x01')) {
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<
                        (&local_1a8,(char (*) [27])"// ERROR: expected GL_TRUE");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyStencilMaskInitial (tcu::TestContext& testCtx, GLenum name, int stencilBits)
{
	// if stencilBits == 0, the mask is allowed to be either GL_TRUE or GL_FALSE
	// otherwise it must be GL_TRUE
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean> state;
	glGetBooleanv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (stencilBits > 0 && state != GL_TRUE)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected GL_TRUE" << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}